

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swish_x86.cpp
# Opt level: O2

int __thiscall ncnn::Swish_x86::forward_inplace(Swish_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  undefined1 auVar2 [16];
  void *pvVar3;
  int iVar4;
  float *pfVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  Mat local_78;
  
  iVar7 = bottom_top_blob->c;
  iVar9 = bottom_top_blob->h * bottom_top_blob->w;
  if (bottom_top_blob->elempack == 4) {
    iVar6 = 0;
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    for (; iVar6 != iVar7; iVar6 = iVar6 + 1) {
      Mat::channel(&local_78,bottom_top_blob,iVar6);
      pfVar5 = (float *)local_78.data;
      Mat::~Mat(&local_78);
      auVar14 = _DAT_002d7fc0;
      auVar24 = _DAT_002d7fb0;
      iVar4 = iVar9;
      while (bVar10 = iVar4 != 0, iVar4 = iVar4 + -1, bVar10) {
        fVar1 = pfVar5[2];
        fVar11 = pfVar5[3];
        auVar22._0_8_ = *(ulong *)pfVar5 ^ 0x8000000080000000;
        auVar22._8_4_ = -fVar1;
        auVar22._12_4_ = -fVar11;
        auVar23 = minps(auVar22,auVar24);
        auVar23 = maxps(auVar23,auVar14);
        fVar12 = auVar23._0_4_ * 1.442695 + 0.5;
        fVar15 = auVar23._4_4_ * 1.442695 + 0.5;
        fVar16 = auVar23._8_4_ * 1.442695 + 0.5;
        fVar17 = auVar23._12_4_ * 1.442695 + 0.5;
        fVar18 = (float)(int)fVar12;
        fVar19 = (float)(int)fVar15;
        fVar20 = (float)(int)fVar16;
        fVar21 = (float)(int)fVar17;
        fVar18 = fVar18 - (float)(-(uint)(fVar12 < fVar18) & 0x3f800000);
        fVar19 = fVar19 - (float)(-(uint)(fVar15 < fVar19) & 0x3f800000);
        fVar20 = fVar20 - (float)(-(uint)(fVar16 < fVar20) & 0x3f800000);
        fVar21 = fVar21 - (float)(-(uint)(fVar17 < fVar21) & 0x3f800000);
        fVar12 = fVar18 * -0.6931472 + auVar23._0_4_;
        fVar15 = fVar19 * -0.6931472 + auVar23._4_4_;
        fVar16 = fVar20 * -0.6931472 + auVar23._8_4_;
        fVar17 = fVar21 * -0.6931472 + auVar23._12_4_;
        auVar13._0_4_ =
             fVar12 + 1.0 +
             (((((fVar12 * 0.00019875691 + 0.0013981999) * fVar12 + 0.008333452) * fVar12 +
               0.041665796) * fVar12 + 0.16666666) * fVar12 + 0.5) * fVar12 * fVar12;
        auVar13._4_4_ =
             fVar15 + 1.0 +
             (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
               0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5) * fVar15 * fVar15;
        auVar13._8_4_ =
             fVar16 + 1.0 +
             (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
               0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5) * fVar16 * fVar16;
        auVar13._12_4_ =
             fVar17 + 1.0 +
             (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
               0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5) * fVar17 * fVar17;
        fVar12 = (float)((int)fVar18 * 0x800000 + 0x3f800000) * auVar13._0_4_ + 1.0;
        fVar15 = (float)((int)fVar19 * 0x800000 + 0x3f800000) * auVar13._4_4_ + 1.0;
        fVar16 = (float)((int)fVar20 * 0x800000 + 0x3f800000) * auVar13._8_4_ + 1.0;
        fVar17 = (float)((int)fVar21 * 0x800000 + 0x3f800000) * auVar13._12_4_ + 1.0;
        auVar2._4_4_ = fVar15;
        auVar2._0_4_ = fVar12;
        auVar2._8_4_ = fVar16;
        auVar2._12_4_ = fVar17;
        auVar23 = rcpps(auVar13,auVar2);
        fVar18 = *pfVar5 * auVar23._0_4_;
        fVar19 = pfVar5[1] * auVar23._4_4_;
        fVar20 = fVar1 * auVar23._8_4_;
        fVar21 = fVar11 * auVar23._12_4_;
        *pfVar5 = (*pfVar5 - fVar12 * fVar18) * auVar23._0_4_ + fVar18;
        pfVar5[1] = (pfVar5[1] - fVar15 * fVar19) * auVar23._4_4_ + fVar19;
        pfVar5[2] = (fVar1 - fVar16 * fVar20) * auVar23._8_4_ + fVar20;
        pfVar5[3] = (fVar11 - fVar17 * fVar21) * auVar23._12_4_ + fVar21;
        pfVar5 = pfVar5 + 4;
      }
    }
  }
  else {
    iVar6 = 0;
    if (iVar7 < 1) {
      iVar7 = 0;
      iVar6 = 0;
    }
    for (; iVar6 != iVar7; iVar6 = iVar6 + 1) {
      Mat::channel(&local_78,bottom_top_blob,iVar6);
      pvVar3 = local_78.data;
      Mat::~Mat(&local_78);
      lVar8 = 0;
      pfVar5 = (float *)pvVar3;
      for (iVar4 = 0; iVar4 + 3 < iVar9; iVar4 = iVar4 + 4) {
        fVar1 = pfVar5[2];
        fVar11 = pfVar5[3];
        auVar23._0_8_ = *(ulong *)pfVar5 ^ 0x8000000080000000;
        auVar23._8_4_ = -fVar1;
        auVar23._12_4_ = -fVar11;
        auVar24 = minps(auVar23,_DAT_002d7fb0);
        auVar24 = maxps(auVar24,_DAT_002d7fc0);
        fVar12 = auVar24._0_4_ * 1.442695 + 0.5;
        fVar15 = auVar24._4_4_ * 1.442695 + 0.5;
        fVar16 = auVar24._8_4_ * 1.442695 + 0.5;
        fVar17 = auVar24._12_4_ * 1.442695 + 0.5;
        fVar18 = (float)(int)fVar12;
        fVar19 = (float)(int)fVar15;
        fVar20 = (float)(int)fVar16;
        fVar21 = (float)(int)fVar17;
        fVar18 = fVar18 - (float)(-(uint)(fVar12 < fVar18) & 0x3f800000);
        fVar19 = fVar19 - (float)(-(uint)(fVar15 < fVar19) & 0x3f800000);
        fVar20 = fVar20 - (float)(-(uint)(fVar16 < fVar20) & 0x3f800000);
        fVar21 = fVar21 - (float)(-(uint)(fVar17 < fVar21) & 0x3f800000);
        fVar12 = fVar18 * -0.6931472 + auVar24._0_4_;
        fVar15 = fVar19 * -0.6931472 + auVar24._4_4_;
        fVar16 = fVar20 * -0.6931472 + auVar24._8_4_;
        fVar17 = fVar21 * -0.6931472 + auVar24._12_4_;
        auVar14._0_4_ =
             fVar12 + 1.0 +
             (((((fVar12 * 0.00019875691 + 0.0013981999) * fVar12 + 0.008333452) * fVar12 +
               0.041665796) * fVar12 + 0.16666666) * fVar12 + 0.5) * fVar12 * fVar12;
        auVar14._4_4_ =
             fVar15 + 1.0 +
             (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
               0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5) * fVar15 * fVar15;
        auVar14._8_4_ =
             fVar16 + 1.0 +
             (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
               0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5) * fVar16 * fVar16;
        auVar14._12_4_ =
             fVar17 + 1.0 +
             (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
               0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5) * fVar17 * fVar17;
        fVar12 = (float)((int)fVar18 * 0x800000 + 0x3f800000) * auVar14._0_4_ + 1.0;
        fVar15 = (float)((int)fVar19 * 0x800000 + 0x3f800000) * auVar14._4_4_ + 1.0;
        fVar16 = (float)((int)fVar20 * 0x800000 + 0x3f800000) * auVar14._8_4_ + 1.0;
        fVar17 = (float)((int)fVar21 * 0x800000 + 0x3f800000) * auVar14._12_4_ + 1.0;
        auVar24._4_4_ = fVar15;
        auVar24._0_4_ = fVar12;
        auVar24._8_4_ = fVar16;
        auVar24._12_4_ = fVar17;
        auVar24 = rcpps(auVar14,auVar24);
        fVar18 = *pfVar5 * auVar24._0_4_;
        fVar19 = pfVar5[1] * auVar24._4_4_;
        fVar20 = fVar1 * auVar24._8_4_;
        fVar21 = fVar11 * auVar24._12_4_;
        *pfVar5 = (*pfVar5 - fVar12 * fVar18) * auVar24._0_4_ + fVar18;
        pfVar5[1] = (pfVar5[1] - fVar15 * fVar19) * auVar24._4_4_ + fVar19;
        pfVar5[2] = (fVar1 - fVar16 * fVar20) * auVar24._8_4_ + fVar20;
        pfVar5[3] = (fVar11 - fVar17 * fVar21) * auVar24._12_4_ + fVar21;
        pfVar5 = pfVar5 + 4;
        lVar8 = lVar8 + 4;
      }
      for (; (int)lVar8 < iVar9; lVar8 = lVar8 + 1) {
        fVar1 = *(float *)((long)pvVar3 + lVar8 * 4);
        fVar11 = expf(-fVar1);
        *(float *)((long)pvVar3 + lVar8 * 4) = fVar1 / (fVar11 + 1.0);
      }
    }
  }
  return 0;
}

Assistant:

int Swish_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, swish_avx(_p));
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, swish_sse(_p));
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, swish_avx(_p));
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _mm_storeu_ps(ptr, swish_sse(_p));
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr / (1.f + exp(-*ptr));
            ptr++;
        }
    }

    return 0;
}